

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O2

bool absl::anon_unknown_0::SafeAddRepHi(double a_hi,double b_hi,Duration *d)

{
  undefined8 in_RDX;
  double dVar1;
  Duration DVar2;
  
  dVar1 = a_hi + b_hi;
  if (9.223372036854776e+18 <= dVar1) {
    d->rep_hi_ = 0x7fffffffffffffff;
    d->rep_lo_ = 0xffffffff;
  }
  else {
    if (-9.223372036854776e+18 < dVar1) {
      d->rep_hi_ = (long)dVar1;
      return true;
    }
    DVar2._8_8_ = in_RDX;
    DVar2.rep_hi_ = -1;
    DVar2 = operator-((absl *)0x7fffffffffffffff,DVar2);
    d->rep_hi_ = DVar2.rep_hi_;
    d->rep_lo_ = DVar2.rep_lo_;
  }
  return false;
}

Assistant:

inline bool SafeAddRepHi(double a_hi, double b_hi, Duration* d) {
  double c = a_hi + b_hi;
  if (c >= static_cast<double>(kint64max)) {
    *d = InfiniteDuration();
    return false;
  }
  if (c <= static_cast<double>(kint64min)) {
    *d = -InfiniteDuration();
    return false;
  }
  *d = time_internal::MakeDuration(c, time_internal::GetRepLo(*d));
  return true;
}